

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

BeliefSetNonStationary * __thiscall
AlphaVectorPlanning::SampleBeliefsNonStationary
          (BeliefSetNonStationary *__return_storage_ptr__,AlphaVectorPlanning *this,Arguments *args)

{
  int in_R9D;
  double in_XMM0_Qa;
  
  SampleBeliefsNonStationary
            (__return_storage_ptr__,this,args->nrBeliefs,args->uniqueBeliefs,args->resetAfter,in_R9D
             ,in_XMM0_Qa);
  return __return_storage_ptr__;
}

Assistant:

BeliefSetNonStationary
AlphaVectorPlanning::SampleBeliefsNonStationary(
    const ArgumentHandlers::Arguments &args) const
{
    return(SampleBeliefsNonStationary(args.nrBeliefs,
                                      args.uniqueBeliefs,
                                      args.resetAfter,
                                      args.useQMDPforSamplingBeliefs,
                                      args.QMDPexploreProb));
}